

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O0

int bin_mdef_write_text(bin_mdef_t *m,char *filename)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  uint local_3c;
  uint local_38;
  int n_state_1;
  int n_state;
  int n_total_state;
  int i;
  int p;
  FILE *fh;
  char *filename_local;
  bin_mdef_t *m_local;
  
  iVar1 = strcmp(filename,"-");
  if (iVar1 == 0) {
    _i = _stdout;
  }
  else {
    _i = fopen(filename,"w");
    if (_i == (FILE *)0x0) {
      return -1;
    }
  }
  fprintf(_i,"0.3\n");
  fprintf(_i,"%d n_base\n",(ulong)(uint)m->n_ciphone);
  fprintf(_i,"%d n_tri\n",(ulong)(uint)(m->n_phone - m->n_ciphone));
  if (m->n_emit_state == 0) {
    n_state_1 = 0;
    for (n_state = 0; n_state < m->n_phone; n_state = n_state + 1) {
      n_state_1 = m->sseq_len[m->phone[n_state].ssid] + 1 + n_state_1;
    }
  }
  else {
    n_state_1 = m->n_phone * (m->n_emit_state + 1);
  }
  fprintf(_i,"%d n_state_map\n",(ulong)(uint)n_state_1);
  fprintf(_i,"%d n_tied_state\n",(ulong)(uint)m->n_sen);
  fprintf(_i,"%d n_tied_ci_state\n",(ulong)(uint)m->n_ci_sen);
  fprintf(_i,"%d n_tied_tmat\n",(ulong)(uint)m->n_tmat);
  fprintf(_i,"#\n# Columns definitions\n");
  pcVar2 = "attrib";
  pcVar3 = "tmat";
  pcVar4 = "     ... state id\'s ...";
  fprintf(_i,"#%4s %3s %3s %1s %6s %4s %s\n","base","lft","rt","p","attrib","tmat",
          "     ... state id\'s ...");
  for (n_total_state = 0; n_total_state < m->n_ciphone; n_total_state = n_total_state + 1) {
    fprintf(_i,"%5s %3s %3s %1s",m->ciname[n_total_state],"-","-","-",pcVar2,pcVar3,pcVar4);
    if (n_total_state < m->n_ciphone) {
      if (m->phone[n_total_state].info.ci.filler == '\0') goto LAB_00105cca;
LAB_00105caf:
      fprintf(_i," %6s","filler");
    }
    else {
      if (m->phone[m->phone[n_total_state].info.ci.reserved[0]].info.ci.filler != '\0')
      goto LAB_00105caf;
LAB_00105cca:
      fprintf(_i," %6s","n/a");
    }
    fprintf(_i," %4d",(ulong)(uint)m->phone[n_total_state].tmat);
    if (m->n_emit_state == 0) {
      local_38 = (uint)m->sseq_len[m->phone[n_total_state].ssid];
    }
    else {
      local_38 = m->n_emit_state;
    }
    for (n_state = 0; n_state < (int)local_38; n_state = n_state + 1) {
      fprintf(_i," %6u",(ulong)m->sseq[m->phone[n_total_state].ssid][n_state]);
    }
    fprintf(_i," N\n");
  }
  do {
    if (m->n_phone <= n_total_state) {
      iVar1 = strcmp(filename,"-");
      if (iVar1 != 0) {
        fclose(_i);
      }
      return 0;
    }
    fprintf(_i,"%5s %3s %3s %c",m->ciname[m->phone[n_total_state].info.ci.reserved[0]],
            m->ciname[m->phone[n_total_state].info.ci.reserved[1]],
            m->ciname[m->phone[n_total_state].info.ci.reserved[2]],
            (ulong)(uint)(int)"ibesu"[m->phone[n_total_state].info.ci.filler],pcVar2,pcVar3,pcVar4);
    if (n_total_state < m->n_ciphone) {
      if (m->phone[n_total_state].info.ci.filler == '\0') goto LAB_00105ee2;
LAB_00105ec7:
      fprintf(_i," %6s","filler");
    }
    else {
      if (m->phone[m->phone[n_total_state].info.ci.reserved[0]].info.ci.filler != '\0')
      goto LAB_00105ec7;
LAB_00105ee2:
      fprintf(_i," %6s","n/a");
    }
    fprintf(_i," %4d",(ulong)(uint)m->phone[n_total_state].tmat);
    if (m->n_emit_state == 0) {
      local_3c = (uint)m->sseq_len[m->phone[n_total_state].ssid];
    }
    else {
      local_3c = m->n_emit_state;
    }
    for (n_state = 0; n_state < (int)local_3c; n_state = n_state + 1) {
      fprintf(_i," %6u",(ulong)m->sseq[m->phone[n_total_state].ssid][n_state]);
    }
    fprintf(_i," N\n");
    n_total_state = n_total_state + 1;
  } while( true );
}

Assistant:

int
bin_mdef_write_text(bin_mdef_t * m, const char *filename)
{
    FILE *fh;
    int p, i, n_total_state;

    if (strcmp(filename, "-") == 0)
        fh = stdout;
    else {
        if ((fh = fopen(filename, "w")) == NULL)
            return -1;
    }

    fprintf(fh, "0.3\n");
    fprintf(fh, "%d n_base\n", m->n_ciphone);
    fprintf(fh, "%d n_tri\n", m->n_phone - m->n_ciphone);
    if (m->n_emit_state)
        n_total_state = m->n_phone * (m->n_emit_state + 1);
    else {
        n_total_state = 0;
        for (i = 0; i < m->n_phone; ++i)
            n_total_state += m->sseq_len[m->phone[i].ssid] + 1;
    }
    fprintf(fh, "%d n_state_map\n", n_total_state);
    fprintf(fh, "%d n_tied_state\n", m->n_sen);
    fprintf(fh, "%d n_tied_ci_state\n", m->n_ci_sen);
    fprintf(fh, "%d n_tied_tmat\n", m->n_tmat);
    fprintf(fh, "#\n# Columns definitions\n");
    fprintf(fh, "#%4s %3s %3s %1s %6s %4s %s\n",
            "base", "lft", "rt", "p", "attrib", "tmat",
            "     ... state id's ...");

    for (p = 0; p < m->n_ciphone; p++) {
        int n_state;

        fprintf(fh, "%5s %3s %3s %1s", m->ciname[p], "-", "-", "-");

        if (bin_mdef_is_fillerphone(m, p))
            fprintf(fh, " %6s", "filler");
        else
            fprintf(fh, " %6s", "n/a");
        fprintf(fh, " %4d", m->phone[p].tmat);

        if (m->n_emit_state)
            n_state = m->n_emit_state;
        else
            n_state = m->sseq_len[m->phone[p].ssid];
        for (i = 0; i < n_state; i++) {
            fprintf(fh, " %6u", m->sseq[m->phone[p].ssid][i]);
        }
        fprintf(fh, " N\n");
    }


    for (; p < m->n_phone; p++) {
        int n_state;

        fprintf(fh, "%5s %3s %3s %c",
                m->ciname[m->phone[p].info.cd.ctx[0]],
                m->ciname[m->phone[p].info.cd.ctx[1]],
                m->ciname[m->phone[p].info.cd.ctx[2]],
                (WPOS_NAME)[m->phone[p].info.cd.wpos]);

        if (bin_mdef_is_fillerphone(m, p))
            fprintf(fh, " %6s", "filler");
        else
            fprintf(fh, " %6s", "n/a");
        fprintf(fh, " %4d", m->phone[p].tmat);


        if (m->n_emit_state)
            n_state = m->n_emit_state;
        else
            n_state = m->sseq_len[m->phone[p].ssid];
        for (i = 0; i < n_state; i++) {
            fprintf(fh, " %6u", m->sseq[m->phone[p].ssid][i]);
        }
        fprintf(fh, " N\n");
    }

    if (strcmp(filename, "-") != 0)
        fclose(fh);
    return 0;
}